

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

void SetSuperRound(TT_ExecContext exc,FT_F2Dot14 GridPeriod,FT_Long selector)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  switch((uint)((ulong)selector >> 6) & 3) {
  case 0:
    exc->period = (ulong)((ushort)GridPeriod >> 1);
    uVar1 = (uint)((ulong)selector >> 4) & 3;
    uVar2 = (ulong)uVar1;
    switch(uVar1) {
    case 0:
      goto switchD_00174690_caseD_0;
    case 1:
      goto switchD_00174690_caseD_1;
    case 2:
switchD_00174690_caseD_2:
      uVar2 = exc->period / 2;
      goto switchD_00174690_caseD_0;
    case 3:
switchD_00174690_caseD_3:
      lVar3 = exc->period * 3;
    }
    goto LAB_001746ea;
  case 1:
    exc->period = (ulong)(ushort)GridPeriod;
    uVar1 = (uint)((ulong)selector >> 4) & 3;
    uVar2 = (ulong)uVar1;
    switch(uVar1) {
    case 0:
      goto switchD_00174690_caseD_0;
    case 2:
      goto switchD_00174690_caseD_2;
    case 3:
      goto switchD_00174690_caseD_3;
    }
    break;
  case 2:
    exc->period = (ulong)((uint)(ushort)GridPeriod * 2);
    uVar1 = (uint)((ulong)selector >> 4) & 3;
    uVar2 = (ulong)uVar1;
    switch(uVar1) {
    case 0:
      goto switchD_00174690_caseD_0;
    case 2:
      goto switchD_00174690_caseD_2;
    case 3:
      goto switchD_00174690_caseD_3;
    }
    break;
  case 3:
    exc->period = (ulong)(ushort)GridPeriod;
    uVar1 = (uint)((ulong)selector >> 4) & 3;
    uVar2 = (ulong)uVar1;
    switch(uVar1) {
    case 0:
      goto switchD_00174690_caseD_0;
    case 2:
      goto switchD_00174690_caseD_2;
    case 3:
      goto switchD_00174690_caseD_3;
    }
  }
switchD_00174690_caseD_1:
  lVar3 = exc->period;
LAB_001746ea:
  lVar4 = lVar3 + 3;
  if (-1 < lVar3) {
    lVar4 = lVar3;
  }
  uVar2 = lVar4 >> 2;
switchD_00174690_caseD_0:
  exc->phase = uVar2;
  if ((selector & 0xfU) == 0) {
    lVar3 = exc->period + -1;
  }
  else {
    lVar4 = ((selector & 0xfU) - 4) * exc->period;
    lVar3 = lVar4 + 7;
    if (-1 < lVar4) {
      lVar3 = lVar4;
    }
    lVar3 = lVar3 >> 3;
  }
  exc->period = exc->period >> 8;
  exc->phase = exc->phase >> 8;
  exc->threshold = lVar3 >> 8;
  return;
}

Assistant:

static void
  SetSuperRound( TT_ExecContext  exc,
                 FT_F2Dot14      GridPeriod,
                 FT_Long         selector )
  {
    switch ( (FT_Int)( selector & 0xC0 ) )
    {
      case 0:
        exc->period = GridPeriod / 2;
        break;

      case 0x40:
        exc->period = GridPeriod;
        break;

      case 0x80:
        exc->period = GridPeriod * 2;
        break;

      /* This opcode is reserved, but... */
      case 0xC0:
        exc->period = GridPeriod;
        break;
    }

    switch ( (FT_Int)( selector & 0x30 ) )
    {
    case 0:
      exc->phase = 0;
      break;

    case 0x10:
      exc->phase = exc->period / 4;
      break;

    case 0x20:
      exc->phase = exc->period / 2;
      break;

    case 0x30:
      exc->phase = exc->period * 3 / 4;
      break;
    }

    if ( ( selector & 0x0F ) == 0 )
      exc->threshold = exc->period - 1;
    else
      exc->threshold = ( (FT_Int)( selector & 0x0F ) - 4 ) * exc->period / 8;

    /* convert to F26Dot6 format */
    exc->period    >>= 8;
    exc->phase     >>= 8;
    exc->threshold >>= 8;
  }